

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS
ref_gather_node_tec_part
          (REF_NODE ref_node,REF_GLOB nnode,REF_GLOB *l2c,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  size_t __size;
  REF_MPI pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  REF_INT *sorted_index;
  REF_GLOB *original;
  void *pvVar8;
  void *output;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  REF_INT n;
  char *pcVar19;
  REF_STATUS ref_private_macro_code_rxs;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  double *pdVar23;
  void *pvVar24;
  double dVar25;
  double dVar26;
  REF_INT position;
  uint local_f4;
  int local_94;
  size_t local_90;
  ulong local_88;
  double *local_80;
  long local_78;
  FILE *local_70;
  REF_MPI local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  long local_40;
  REF_DBL *local_38;
  
  pRVar1 = ref_node->ref_mpi;
  iVar18 = ref_node->max;
  lVar15 = (long)iVar18;
  if (lVar15 < 1) {
    uVar3 = 0;
  }
  else {
    lVar10 = 0;
    uVar3 = 0;
    do {
      if (l2c[lVar10] != -1) {
        uVar3 = uVar3 + (pRVar1->id == ref_node->part[lVar10]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar15 != lVar10);
  }
  if ((int)uVar3 < 0) {
    pcVar19 = "malloc sorted_local of REF_INT negative";
    uVar14 = 0x96;
LAB_001592c0:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar14
           ,"ref_gather_node_tec_part",pcVar19);
    RVar4 = 1;
  }
  else {
    __size = (ulong)uVar3 * 4;
    local_70 = (FILE *)file;
    local_38 = scalar;
    sorted_index = (REF_INT *)malloc(__size);
    if (sorted_index == (REF_INT *)0x0) {
      pcVar19 = "malloc sorted_local of REF_INT NULL";
      uVar14 = 0x96;
    }
    else {
      original = (REF_GLOB *)malloc((ulong)uVar3 << 3);
      if (original == (REF_GLOB *)0x0) {
        pcVar19 = "malloc sorted_cellnode of REF_GLOB NULL";
        uVar14 = 0x97;
      }
      else {
        pvVar8 = malloc(__size);
        if (pvVar8 == (void *)0x0) {
          pcVar19 = "malloc pack of REF_INT NULL";
          uVar14 = 0x98;
        }
        else {
          if (iVar18 < 1) {
            uVar22 = 0;
          }
          else {
            lVar10 = 0;
            uVar22 = 0;
            do {
              if ((l2c[lVar10] != -1) && (pRVar1->id == ref_node->part[lVar10])) {
                iVar18 = (int)uVar22;
                original[iVar18] = l2c[lVar10];
                *(int *)((long)pvVar8 + (long)iVar18 * 4) = (int)lVar10;
                uVar22 = (ulong)(iVar18 + 1);
              }
              lVar10 = lVar10 + 1;
            } while (lVar15 != lVar10);
          }
          n = (REF_INT)uVar22;
          uVar3 = ref_sort_heap_glob(n,original,sorted_index);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xa3,"ref_gather_node_tec_part",(ulong)uVar3,"sort");
            return uVar3;
          }
          if (0 < n) {
            uVar11 = 0;
            do {
              iVar18 = *(int *)((long)pvVar8 + (long)sorted_index[uVar11] * 4);
              sorted_index[uVar11] = iVar18;
              original[uVar11] = l2c[iVar18];
              uVar11 = uVar11 + 1;
            } while (uVar22 != uVar11);
          }
          uVar3 = ldim + 4;
          free(pvVar8);
          iVar5 = (int)(nnode / (long)pRVar1->n) + 1;
          iVar18 = 100000;
          if (100000 < iVar5) {
            iVar18 = iVar5;
          }
          iVar5 = pRVar1->reduce_byte_limit;
          iVar6 = 0x7fffffff;
          if (0 < iVar5) {
            iVar6 = iVar5 / (int)(uVar3 * 8);
          }
          iVar20 = 0x7fffffff;
          if (iVar18 < iVar6) {
            iVar20 = iVar18;
          }
          if ((0 < iVar5) && (iVar6 <= iVar18)) {
            iVar20 = iVar5 / (int)(uVar3 * 8);
          }
          uVar21 = iVar20 * uVar3;
          if ((int)uVar21 < 0) {
            pcVar19 = "malloc local_xyzm of REF_DBL negative";
            uVar14 = 0xaf;
            goto LAB_001592c0;
          }
          uVar22 = (ulong)uVar21;
          pvVar8 = malloc(uVar22 * 8);
          if (pvVar8 == (void *)0x0) {
            pcVar19 = "malloc local_xyzm of REF_DBL NULL";
            uVar14 = 0xaf;
          }
          else {
            output = malloc(uVar22 * 8);
            if (output != (void *)0x0) {
              local_90 = uVar22;
              local_88 = (ulong)uVar3;
              if (0 < nnode) {
                uVar7 = ldim + 3;
                local_60 = (long)iVar20;
                local_90 = uVar22 << 3;
                local_50 = 1;
                if (1 < (int)uVar7) {
                  local_50 = (ulong)uVar7;
                }
                lVar15 = (long)(int)uVar3;
                local_58 = (ulong)(uint)ldim;
                local_80 = (double *)((long)pvVar8 + (long)(int)uVar7 * 8);
                local_48 = (void *)((long)output + (long)(int)uVar7 * 8);
                local_40 = lVar15 << 0x20;
                lVar10 = 0;
                local_f4 = 0;
                local_78 = lVar15;
                local_68 = pRVar1;
                do {
                  pRVar1 = local_68;
                  lVar16 = nnode - lVar10;
                  if (local_60 <= nnode - lVar10) {
                    lVar16 = local_60;
                  }
                  if (uVar21 != 0) {
                    memset(pvVar8,0,local_90);
                  }
                  uVar3 = (uint)lVar16;
                  if (0 < (int)uVar3) {
                    lVar16 = 0x300000000;
                    uVar22 = 0;
                    do {
                      uVar7 = ref_sort_search_glob(n,original,lVar10 + uVar22,&local_94);
                      if ((uVar7 != 0) && (uVar7 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xbf,"ref_gather_node_tec_part",(ulong)uVar7,"node local failed");
                        local_f4 = uVar7;
                      }
                      if (uVar7 != 5) {
                        if (uVar7 != 0) {
                          return local_f4;
                        }
                        lVar12 = (long)sorted_index[local_94];
                        lVar9 = uVar22 * local_78;
                        pRVar2 = ref_node->real;
                        *(REF_DBL *)((long)pvVar8 + lVar9 * 8) = pRVar2[lVar12 * 0xf];
                        *(REF_DBL *)((long)pvVar8 + lVar9 * 8 + 8) = pRVar2[lVar12 * 0xf + 1];
                        *(REF_DBL *)((long)pvVar8 + lVar9 * 8 + 0x10) = pRVar2[lVar12 * 0xf + 2];
                        if (0 < ldim) {
                          uVar11 = 0;
                          lVar13 = lVar16;
                          do {
                            *(REF_DBL *)((long)pvVar8 + (lVar13 >> 0x1d)) =
                                 local_38[lVar12 * ldim + uVar11];
                            uVar11 = uVar11 + 1;
                            lVar13 = lVar13 + 0x100000000;
                          } while (local_58 != uVar11);
                        }
                        local_80[lVar9] = 1.0;
                      }
                      uVar22 = uVar22 + 1;
                      lVar16 = lVar16 + local_40;
                    } while (uVar22 != (uVar3 & 0x7fffffff));
                  }
                  if (0 < (int)uVar3) {
                    uVar22 = (ulong)(uVar3 & 0x7fffffff);
                    lVar16 = lVar10;
                    pdVar23 = local_80;
                    do {
                      dVar26 = *pdVar23;
                      dVar25 = dVar26 + -1.0;
                      if (dVar25 <= -dVar25) {
                        dVar25 = -dVar25;
                      }
                      if (0.1 < dVar25) {
                        if (dVar26 <= -dVar26) {
                          dVar26 = -dVar26;
                        }
                        if (0.1 < dVar26) {
                          printf("%s: %d: %s: before sum %ld %f\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                                 ,0xd0,"ref_gather_node_tec_part",lVar16);
                        }
                      }
                      pdVar23 = pdVar23 + lVar15;
                      lVar16 = lVar16 + 1;
                      uVar22 = uVar22 - 1;
                    } while (uVar22 != 0);
                  }
                  uVar7 = ref_mpi_sum(pRVar1,pvVar8,output,(int)local_88 * uVar3,3);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0xd4,"ref_gather_node_tec_part",(ulong)uVar7,"sum");
                    return uVar7;
                  }
                  if ((pRVar1->id == 0) && (0 < (int)uVar3)) {
                    uVar22 = 0;
                    pvVar24 = output;
                    do {
                      dVar26 = *(double *)((long)local_48 + uVar22 * local_78 * 8) + -1.0;
                      if (dVar26 <= -dVar26) {
                        dVar26 = -dVar26;
                      }
                      if (0.1 < dVar26) {
                        printf("%s: %d: %s: after sum %ld %f\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0xda,"ref_gather_node_tec_part",lVar10 + uVar22);
                      }
                      uVar11 = local_50;
                      if (-3 < ldim) {
                        uVar17 = 0;
                        do {
                          fprintf(local_70," %.15e",*(undefined8 *)((long)pvVar24 + uVar17 * 8));
                          uVar17 = uVar17 + 1;
                        } while (uVar11 != uVar17);
                      }
                      fwrite(" \n",2,1,local_70);
                      uVar22 = uVar22 + 1;
                      pvVar24 = (void *)((long)pvVar24 + lVar15 * 8);
                    } while (uVar22 != (uVar3 & 0x7fffffff));
                  }
                  lVar10 = lVar10 + (int)uVar3;
                } while (lVar10 < nnode);
              }
              free(output);
              free(pvVar8);
              free(original);
              free(sorted_index);
              return 0;
            }
            pcVar19 = "malloc xyzm of REF_DBL NULL";
            uVar14 = 0xb0;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar14
           ,"ref_gather_node_tec_part",pcVar19);
    RVar4 = 2;
  }
  return RVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_tec_part(REF_NODE ref_node,
                                                   REF_GLOB nnode,
                                                   REF_GLOB *l2c, REF_INT ldim,
                                                   REF_DBL *scalar,
                                                   FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB nnode_written, first, global;
  REF_INT local, n, i, id;
  REF_STATUS status;
  REF_INT dim = 3 + ldim + 1;
  REF_INT *sorted_local, *pack, total_cellnode, position;
  REF_GLOB *sorted_cellnode;

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      total_cellnode++;
    }
  }

  ref_malloc(sorted_local, total_cellnode, REF_INT);
  ref_malloc(sorted_cellnode, total_cellnode, REF_GLOB);
  ref_malloc(pack, total_cellnode, REF_INT);

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      sorted_cellnode[total_cellnode] = l2c[i];
      pack[total_cellnode] = i;
      total_cellnode++;
    }
  }
  RSS(ref_sort_heap_glob(total_cellnode, sorted_cellnode, sorted_local),
      "sort");
  for (i = 0; i < total_cellnode; i++) {
    sorted_local[i] = pack[sorted_local[i]];
    sorted_cellnode[i] = l2c[sorted_local[i]];
  }
  ref_free(pack);

  chunk = (REF_INT)(nnode / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);
  chunk = MIN(chunk, ref_mpi_reduce_chunk_limit(
                         ref_mpi, dim * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, dim * chunk, REF_DBL);
  ref_malloc(xyzm, dim * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < nnode) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk, nnode - nnode_written);

    nnode_written += n;

    for (i = 0; i < dim * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_sort_search_glob(total_cellnode, sorted_cellnode, global,
                                    &position);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status) {
        local = sorted_local[position];
        local_xyzm[0 + dim * i] = ref_node_xyz(ref_node, 0, local);
        local_xyzm[1 + dim * i] = ref_node_xyz(ref_node, 1, local);
        local_xyzm[2 + dim * i] = ref_node_xyz(ref_node, 2, local);
        for (id = 0; id < ldim; id++) {
          local_xyzm[3 + id + dim * i] = scalar[id + ldim * local];
        }
        local_xyzm[3 + ldim + dim * i] = 1.0;
      }
    }

    for (i = 0; i < n; i++) {
      if ((ABS(local_xyzm[3 + ldim + dim * i] - 1.0) > 0.1) &&
          (ABS(local_xyzm[3 + ldim + dim * i] - 0.0) > 0.1)) {
        printf("%s: %d: %s: before sum " REF_GLOB_FMT " %f\n", __FILE__,
               __LINE__, __func__, first + i, local_xyzm[3 + ldim + dim * i]);
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, dim * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi)) {
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[3 + ldim + dim * i] - 1.0) > 0.1) {
          printf("%s: %d: %s: after sum " REF_GLOB_FMT " %f\n", __FILE__,
                 __LINE__, __func__, first + i, xyzm[3 + ldim + dim * i]);
        }
        for (id = 0; id < 3 + ldim; id++) {
          fprintf(file, " %.15e", xyzm[id + dim * i]);
        }
        fprintf(file, " \n");
      }
    }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);
  ref_free(sorted_cellnode);
  ref_free(sorted_local);

  return REF_SUCCESS;
}